

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleServer.cpp
# Opt level: O2

bool __thiscall
CustomServer::on_client_connect
          (CustomServer *this,shared_ptr<blcl::net::connection<MsgType>_> *client)

{
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  undefined8 local_38;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_30;
  
  bVar1 = is_banned(this,client);
  if (!bVar1) {
    _Stack_30._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    _Stack_30._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38 = 0;
    _Stack_30._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    blcl::net::connection<MsgType>::send
              ((client->
               super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,(int)&local_38,__buf,in_RCX,in_R8D);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_30);
  }
  return !bVar1;
}

Assistant:

bool on_client_connect(std::shared_ptr<blcl::net::connection<MsgType>> client) override {
        if (is_banned(client)) {
            return false;
        }

        blcl::net::message<MsgType> msg;
        msg.header.id = MsgType::ServerAccept;
        client->send(msg);

        return true;
    }